

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O0

void __thiscall
FPalette::MakeRemap(FPalette *this,DWORD *colors,BYTE *remap,BYTE *useful,int numcolors)

{
  uint32 uVar1;
  int iVar2;
  int local_1034;
  int local_1030;
  int k;
  int j;
  int i;
  RemappingWork workspace [511];
  int numcolors_local;
  BYTE *useful_local;
  BYTE *remap_local;
  DWORD *colors_local;
  FPalette *this_local;
  
  workspace[0x1fe]._4_4_ = numcolors;
  for (k = 1; k < 0x100; k = k + 1) {
    uVar1 = PalEntry::operator_cast_to_unsigned_int(this->BaseColors + k);
    (&j)[(long)(k + -1) * 2] = uVar1 & 0xffffff;
    workspace[(long)(k + -1) + -1].Foreign = '\0';
    workspace[(long)(k + -1) + -1].PalEntry = (BYTE)k;
  }
  local_1034 = 0;
  local_1030 = 0xff;
  for (k = 0; k < (int)workspace[0x1fe]._4_4_; k = k + 1) {
    if ((useful == (BYTE *)0x0) || (useful[k] != '\0')) {
      (&j)[(long)local_1030 * 2] = colors[k] & 0xffffff;
      workspace[(long)local_1030 + -1].Foreign = '\x01';
      workspace[(long)local_1030 + -1].PalEntry = (BYTE)k;
      local_1030 = local_1030 + 1;
      local_1034 = local_1034 + 1;
    }
    else {
      remap[k] = '\0';
    }
  }
  qsort(&j,(long)local_1030,8,sortforremap2);
  for (k = 0; k < local_1030 + -1; k = k + 1) {
    if (((workspace[(long)k + -1].Foreign != '\0') &&
        (workspace[(long)(k + 1) + -1].Foreign == '\0')) &&
       ((&j)[(long)k * 2] == (&j)[(long)(k + 1) * 2])) {
      remap[workspace[(long)k + -1].PalEntry] = workspace[(long)(k + 1) + -1].PalEntry;
      workspace[(long)k + -1].Foreign = '\x02';
      k = k + 1;
      local_1034 = local_1034 + -1;
    }
  }
  if (0 < local_1034) {
    for (k = 0; k <= local_1030 + -1; k = k + 1) {
      if (workspace[(long)k + -1].Foreign == '\x01') {
        iVar2 = BestColor((uint32 *)this,(uint)(&j)[(long)k * 2] >> 0x10 & 0xff,
                          (uint)(&j)[(long)k * 2] >> 8 & 0xff,(&j)[(long)k * 2] & 0xff,1,0xff);
        remap[workspace[(long)k + -1].PalEntry] = (BYTE)iVar2;
      }
    }
  }
  return;
}

Assistant:

void FPalette::MakeRemap (const DWORD *colors, BYTE *remap, const BYTE *useful, int numcolors) const
{
	RemappingWork workspace[255+256];
	int i, j, k;

	// Fill in workspace with the colors from the passed palette and this palette.
	// By sorting this array, we can quickly find exact matches so that we can
	// minimize the time spent calling BestColor for near matches.

	for (i = 1; i < 256; ++i)
	{
		workspace[i-1].Color = DWORD(BaseColors[i]) & 0xFFFFFF;
		workspace[i-1].Foreign = 0;
		workspace[i-1].PalEntry = i;
	}
	for (i = k = 0, j = 255; i < numcolors; ++i)
	{
		if (useful == NULL || useful[i] != 0)
		{
			workspace[j].Color = colors[i] & 0xFFFFFF;
			workspace[j].Foreign = 1;
			workspace[j].PalEntry = i;
			++j;
			++k;
		}
		else
		{
			remap[i] = 0;
		}
	}
	qsort (workspace, j, sizeof(RemappingWork), sortforremap2);

	// Find exact matches
	--j;
	for (i = 0; i < j; ++i)
	{
		if (workspace[i].Foreign)
		{
			if (!workspace[i+1].Foreign && workspace[i].Color == workspace[i+1].Color)
			{
				remap[workspace[i].PalEntry] = workspace[i+1].PalEntry;
				workspace[i].Foreign = 2;
				++i;
				--k;
			}
		}
	}

	// Find near matches
	if (k > 0)
	{
		for (i = 0; i <= j; ++i)
		{
			if (workspace[i].Foreign == 1)
			{
				remap[workspace[i].PalEntry] = BestColor ((DWORD *)BaseColors,
					RPART(workspace[i].Color), GPART(workspace[i].Color), BPART(workspace[i].Color),
					1, 255);
			}
		}
	}
}